

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O1

Namespace * __thiscall flatbuffers::Parser::UniqueNamespace(Parser *this,Namespace *ns)

{
  pointer *pppNVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__first1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__last1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__first2;
  iterator __position;
  Namespace *pNVar2;
  bool bVar3;
  Namespace *in_RAX;
  undefined7 extraout_var;
  pointer ppNVar4;
  bool bVar5;
  Namespace *local_28;
  
  ppNVar4 = (this->namespaces_).
            super__Vector_base<flatbuffers::Namespace_*,_std::allocator<flatbuffers::Namespace_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  bVar5 = ppNVar4 ==
          (this->namespaces_).
          super__Vector_base<flatbuffers::Namespace_*,_std::allocator<flatbuffers::Namespace_*>_>.
          _M_impl.super__Vector_impl_data._M_finish;
  local_28 = ns;
  do {
    if (bVar5) {
LAB_0011bc02:
      if (bVar5) {
        __position._M_current =
             (this->namespaces_).
             super__Vector_base<flatbuffers::Namespace_*,_std::allocator<flatbuffers::Namespace_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (this->namespaces_).
            super__Vector_base<flatbuffers::Namespace_*,_std::allocator<flatbuffers::Namespace_*>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<flatbuffers::Namespace*,std::allocator<flatbuffers::Namespace*>>::
          _M_realloc_insert<flatbuffers::Namespace*const&>
                    ((vector<flatbuffers::Namespace*,std::allocator<flatbuffers::Namespace*>> *)
                     &this->namespaces_,__position,&local_28);
          in_RAX = local_28;
        }
        else {
          *__position._M_current = local_28;
          pppNVar1 = &(this->namespaces_).
                      super__Vector_base<flatbuffers::Namespace_*,_std::allocator<flatbuffers::Namespace_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          *pppNVar1 = *pppNVar1 + 1;
          in_RAX = local_28;
        }
      }
      return in_RAX;
    }
    __first1 = (local_28->components).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    __last1 = (local_28->components).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    in_RAX = (Namespace *)((long)__last1 - (long)__first1);
    __first2 = ((*ppNVar4)->components).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    if (in_RAX == (Namespace *)
                  ((long)((*ppNVar4)->components).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)__first2)) {
      bVar3 = std::__equal<false>::equal<std::__cxx11::string_const*,std::__cxx11::string_const*>
                        (__first1,__last1,__first2);
      pNVar2 = local_28;
      in_RAX = (Namespace *)CONCAT71(extraout_var,bVar3);
      if (bVar3) {
        if (local_28 != (Namespace *)0x0) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_28->components);
          operator_delete(pNVar2,0x20);
        }
        in_RAX = *ppNVar4;
        goto LAB_0011bc02;
      }
    }
    ppNVar4 = ppNVar4 + 1;
    bVar5 = ppNVar4 ==
            (this->namespaces_).
            super__Vector_base<flatbuffers::Namespace_*,_std::allocator<flatbuffers::Namespace_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  } while( true );
}

Assistant:

Namespace *Parser::UniqueNamespace(Namespace *ns) {
  for (auto it = namespaces_.begin(); it != namespaces_.end(); ++it) {
    if (ns->components == (*it)->components) {
      delete ns;
      return *it;
    }
  }
  namespaces_.push_back(ns);
  return ns;
}